

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.h
# Opt level: O1

NodeData __thiscall
google::protobuf::compiler::
SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::DFS
          (SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator> *this,
          Descriptor *descriptor)

{
  _Rb_tree_header *p_Var1;
  pointer *pppDVar2;
  pointer *ppuVar3;
  uint uVar4;
  iterator iVar5;
  iterator __position;
  iterator __position_00;
  long lVar6;
  pointer *pppSVar7;
  SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator> *this_00;
  int iVar8;
  LogMessage *pLVar9;
  _Base_ptr p_Var10;
  mapped_type *pmVar11;
  ulong uVar12;
  pointer ppDVar13;
  _Rb_tree_header *p_Var14;
  int iVar15;
  Descriptor *extraout_RDX;
  Descriptor *extraout_RDX_00;
  Descriptor *extraout_RDX_01;
  Descriptor *extraout_RDX_02;
  Descriptor *extraout_RDX_03;
  Descriptor *extraout_RDX_04;
  Descriptor *extraout_RDX_05;
  Descriptor *pDVar16;
  Descriptor *extraout_RDX_06;
  Descriptor *extraout_RDX_07;
  _Base_ptr p_Var17;
  SCC *pSVar18;
  pointer ppDVar19;
  __normal_iterator<const_google::protobuf::Descriptor_**,_std::vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>_>
  __i;
  pointer ppDVar20;
  NodeData NVar21;
  pair<std::_Rb_tree_iterator<const_google::protobuf::compiler::SCC_*>,_bool> pVar22;
  Descriptor *scc_desc;
  Descriptor *dep;
  _Head_base<0UL,_google::protobuf::compiler::SCC_*,_false> local_158;
  mapped_type *local_150;
  SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator> *local_148;
  SCC *local_140;
  pointer local_138;
  pointer local_130;
  vector<google::protobuf::compiler::SCC_const*,std::allocator<google::protobuf::compiler::SCC_const*>>
  *local_128;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  local_120;
  LogMessage local_108;
  _Rb_tree<const_google::protobuf::compiler::SCC_*,_const_google::protobuf::compiler::SCC_*,_std::_Identity<const_google::protobuf::compiler::SCC_*>,_std::less<const_google::protobuf::compiler::SCC_*>,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
  local_d0;
  LogMessage local_a0;
  LogMessage local_68;
  
  p_Var1 = &(this->cache_)._M_t._M_impl.super__Rb_tree_header;
  p_Var17 = (this->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var10 = &p_Var1->_M_header;
  for (; p_Var17 != (_Base_ptr)0x0;
      p_Var17 = (&p_Var17->_M_left)[*(Descriptor **)(p_Var17 + 1) < descriptor]) {
    if (*(Descriptor **)(p_Var17 + 1) >= descriptor) {
      p_Var10 = p_Var17;
    }
  }
  p_Var17 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var10 != p_Var1) &&
     (p_Var17 = p_Var10, descriptor < *(Descriptor **)(p_Var10 + 1))) {
    p_Var17 = &p_Var1->_M_header;
  }
  local_158._M_head_impl = (SCC *)descriptor;
  local_148 = this;
  if ((_Rb_tree_header *)p_Var17 != p_Var1) {
    internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/scc.h"
               ,0x5c);
    pLVar9 = internal::LogMessage::operator<<
                       (&local_a0,"CHECK failed: (cache_.count(descriptor)) == (0): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_108,pLVar9);
    internal::LogMessage::~LogMessage(&local_a0);
  }
  this_00 = local_148;
  local_150 = std::
              map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::NodeData>_>_>
              ::operator[](&local_148->cache_,(key_type *)&local_158);
  uVar4 = this_00->index_;
  pDVar16 = (Descriptor *)(ulong)uVar4;
  this_00->index_ = uVar4 + 1;
  local_150->lowlink = uVar4;
  local_150->index = uVar4;
  iVar5._M_current =
       (this_00->stack_).
       super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this_00->stack_).
      super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
    ::_M_realloc_insert<google::protobuf::Descriptor_const*const&>
              ((vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
                *)&this_00->stack_,iVar5,(Descriptor **)&local_158);
    pDVar16 = extraout_RDX;
  }
  else {
    *iVar5._M_current = (Descriptor *)local_158._M_head_impl;
    pppDVar2 = &(this_00->stack_).
                super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppDVar2 = *pppDVar2 + 1;
  }
  js::anon_unknown_0::DepsGenerator::operator()
            ((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
              *)&local_108,(DepsGenerator *)local_158._M_head_impl,pDVar16);
  if ((char *)local_108._0_8_ != local_108.filename_) {
    pSVar18 = (SCC *)local_108._0_8_;
    do {
      pDVar16 = *(Descriptor **)&pSVar18->descriptors;
      local_d0._M_impl._0_8_ = pDVar16;
      if (pDVar16 == (Descriptor *)0x0) {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/scc.h"
                   ,0x66);
        pLVar9 = internal::LogMessage::operator<<(&local_68,"CHECK failed: dep: ");
        internal::LogFinisher::operator=((LogFinisher *)&local_120,pLVar9);
        internal::LogMessage::~LogMessage(&local_68);
      }
      p_Var17 = (this_00->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var10 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var17 != (_Rb_tree_header *)0x0;
          p_Var17 = (&p_Var17->_M_left)[*(Descriptor **)(p_Var17 + 1) < pDVar16]) {
        if (*(Descriptor **)(p_Var17 + 1) >= pDVar16) {
          p_Var10 = p_Var17;
        }
      }
      p_Var14 = p_Var1;
      if (((_Rb_tree_header *)p_Var10 != p_Var1) &&
         (p_Var14 = (_Rb_tree_header *)p_Var10,
         pDVar16 < (Descriptor *)((_Rb_tree_header *)p_Var10)->_M_node_count)) {
        p_Var14 = p_Var1;
      }
      if (p_Var14 == p_Var1) {
        NVar21 = DFS(this_00,pDVar16);
        iVar15 = NVar21.lowlink;
        iVar8 = local_150->lowlink;
LAB_0026494b:
        if (iVar8 < iVar15) {
          iVar15 = iVar8;
        }
        local_150->lowlink = iVar15;
      }
      else {
        pmVar11 = std::
                  map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::NodeData>_>_>
                  ::operator[](&this_00->cache_,(key_type *)&local_d0);
        if (pmVar11->scc == (SCC *)0x0) {
          iVar8 = pmVar11->index;
          iVar15 = local_150->lowlink;
          goto LAB_0026494b;
        }
      }
      pSVar18 = (SCC *)((long)&pSVar18->descriptors + 8);
    } while (pSVar18 != (SCC *)local_108.filename_);
  }
  if ((SCC *)local_108._0_8_ != (SCC *)0x0) {
    operator_delete((void *)local_108._0_8_);
  }
  if (local_150->index == local_150->lowlink) {
    local_108._0_8_ = operator_new(0x30);
    *(undefined8 *)
     &(((SCC *)local_108._0_8_)->descriptors).
      super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
         = 0;
    *(pointer *)
     ((long)&(((SCC *)local_108._0_8_)->descriptors).
             super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
     + 8) = (pointer)0x0;
    *(pointer *)
     ((long)&(((SCC *)local_108._0_8_)->descriptors).
             super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
     + 0x10) = (pointer)0x0;
    *(undefined8 *)
     &(((SCC *)local_108._0_8_)->children).
      super__Vector_base<const_google::protobuf::compiler::SCC_*,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
      ._M_impl = 0;
    *(pointer *)
     ((long)&(((SCC *)local_108._0_8_)->children).
             super__Vector_base<const_google::protobuf::compiler::SCC_*,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
     + 8) = (pointer)0x0;
    *(pointer *)
     ((long)&(((SCC *)local_108._0_8_)->children).
             super__Vector_base<const_google::protobuf::compiler::SCC_*,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
     + 0x10) = (pointer)0x0;
    __position._M_current =
         (this_00->garbage_bin_).
         super__Vector_base<std::unique_ptr<google::protobuf::compiler::SCC,_std::default_delete<google::protobuf::compiler::SCC>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::SCC,_std::default_delete<google::protobuf::compiler::SCC>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->garbage_bin_).
        super__Vector_base<std::unique_ptr<google::protobuf::compiler::SCC,_std::default_delete<google::protobuf::compiler::SCC>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::SCC,_std::default_delete<google::protobuf::compiler::SCC>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::unique_ptr<google::protobuf::compiler::SCC,std::default_delete<google::protobuf::compiler::SCC>>,std::allocator<std::unique_ptr<google::protobuf::compiler::SCC,std::default_delete<google::protobuf::compiler::SCC>>>>
      ::_M_realloc_insert<google::protobuf::compiler::SCC*>
                ((vector<std::unique_ptr<google::protobuf::compiler::SCC,std::default_delete<google::protobuf::compiler::SCC>>,std::allocator<std::unique_ptr<google::protobuf::compiler::SCC,std::default_delete<google::protobuf::compiler::SCC>>>>
                  *)&this_00->garbage_bin_,__position,(SCC **)&local_108);
    }
    else {
      ((__position._M_current)->_M_t).
      super___uniq_ptr_impl<google::protobuf::compiler::SCC,_std::default_delete<google::protobuf::compiler::SCC>_>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::SCC_*,_std::default_delete<google::protobuf::compiler::SCC>_>
      .super__Head_base<0UL,_google::protobuf::compiler::SCC_*,_false>._M_head_impl =
           (SCC *)local_108._0_8_;
      ppuVar3 = &(this_00->garbage_bin_).
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::SCC,_std::default_delete<google::protobuf::compiler::SCC>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::SCC,_std::default_delete<google::protobuf::compiler::SCC>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppuVar3 = *ppuVar3 + 1;
    }
    pSVar18 = (this_00->garbage_bin_).
              super__Vector_base<std::unique_ptr<google::protobuf::compiler::SCC,_std::default_delete<google::protobuf::compiler::SCC>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::SCC,_std::default_delete<google::protobuf::compiler::SCC>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
              super___uniq_ptr_impl<google::protobuf::compiler::SCC,_std::default_delete<google::protobuf::compiler::SCC>_>
              ._M_t.
              super__Tuple_impl<0UL,_google::protobuf::compiler::SCC_*,_std::default_delete<google::protobuf::compiler::SCC>_>
              .super__Head_base<0UL,_google::protobuf::compiler::SCC_*,_false>._M_head_impl;
    do {
      local_108._0_8_ =
           (this_00->stack_).
           super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1];
      iVar5._M_current =
           *(pointer *)
            ((long)&(pSVar18->descriptors).
                    super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
            + 8);
      if (iVar5._M_current ==
          *(pointer *)
           ((long)&(pSVar18->descriptors).
                   super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
           + 0x10)) {
        std::
        vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
        ::_M_realloc_insert<google::protobuf::Descriptor_const*const&>
                  ((vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
                    *)pSVar18,iVar5,(Descriptor **)&local_108);
      }
      else {
        *iVar5._M_current = (Descriptor *)local_108._0_8_;
        pppDVar2 = (pointer *)
                   ((long)&(pSVar18->descriptors).
                           super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                   + 8);
        *pppDVar2 = *pppDVar2 + 1;
      }
      pppDVar2 = &(this_00->stack_).
                  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppDVar2 = *pppDVar2 + -1;
      pmVar11 = std::
                map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::NodeData>_>_>
                ::operator[](&this_00->cache_,(key_type *)&local_108);
      pmVar11->scc = pSVar18;
    } while ((SCC *)local_108._0_8_ != local_158._M_head_impl);
    ppDVar13 = *(pointer *)
                &(pSVar18->descriptors).
                 super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
    ;
    ppDVar19 = *(pointer *)
                ((long)&(pSVar18->descriptors).
                        super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                + 8);
    pDVar16 = extraout_RDX_00;
    if (ppDVar13 != ppDVar19) {
      uVar12 = (long)ppDVar19 - (long)ppDVar13 >> 3;
      lVar6 = 0x3f;
      if (uVar12 != 0) {
        for (; uVar12 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor_const**,std::vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::DFS(google::protobuf::Descriptor_const*)::_lambda(google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*)_1_>>
                (ppDVar13,ppDVar19,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)ppDVar19 - (long)ppDVar13 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor_const**,std::vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::DFS(google::protobuf::Descriptor_const*)::_lambda(google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*)_1_>>
                  (ppDVar13,ppDVar19);
        pDVar16 = extraout_RDX_03;
      }
      else {
        ppDVar20 = ppDVar13 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor_const**,std::vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::DFS(google::protobuf::Descriptor_const*)::_lambda(google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*)_1_>>
                  (ppDVar13,ppDVar20);
        pDVar16 = extraout_RDX_01;
        for (; ppDVar20 != ppDVar19; ppDVar20 = ppDVar20 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor_const**,std::vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::DFS(google::protobuf::Descriptor_const*)::_lambda(google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*)_1_>>
                    (ppDVar20);
          pDVar16 = extraout_RDX_02;
        }
      }
    }
    local_d0._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_d0._M_impl.super__Rb_tree_header._M_header;
    local_d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_d0._M_impl.super__Rb_tree_header._M_node_count = 0;
    ppDVar13 = *(pointer *)
                &(pSVar18->descriptors).
                 super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
    ;
    local_138 = *(pointer *)
                 ((long)&(pSVar18->descriptors).
                         super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                 + 8);
    local_d0._M_impl.super__Rb_tree_header._M_header._M_right =
         local_d0._M_impl.super__Rb_tree_header._M_header._M_left;
    if (ppDVar13 != local_138) {
      local_128 = (vector<google::protobuf::compiler::SCC_const*,std::allocator<google::protobuf::compiler::SCC_const*>>
                   *)&pSVar18->children;
      do {
        local_130 = ppDVar13;
        js::anon_unknown_0::DepsGenerator::operator()(&local_120,(DepsGenerator *)*ppDVar13,pDVar16)
        ;
        ppDVar13 = local_120.
                   super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        pDVar16 = extraout_RDX_04;
        for (ppDVar19 = local_120.
                        super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppDVar19 != ppDVar13;
            ppDVar19 = ppDVar19 + 1) {
          pDVar16 = *ppDVar19;
          if (pDVar16 == (Descriptor *)0x0) {
            internal::LogMessage::LogMessage
                      (&local_108,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/scc.h"
                       ,0x90);
            pLVar9 = internal::LogMessage::operator<<(&local_108,"CHECK failed: child_msg: ");
            internal::LogFinisher::operator=((LogFinisher *)&local_140,pLVar9);
            internal::LogMessage::~LogMessage(&local_108);
          }
          local_140 = GetSCC(local_148,pDVar16);
          pDVar16 = extraout_RDX_05;
          if (local_140 != pSVar18) {
            pVar22 = std::
                     _Rb_tree<google::protobuf::compiler::SCC_const*,google::protobuf::compiler::SCC_const*,std::_Identity<google::protobuf::compiler::SCC_const*>,std::less<google::protobuf::compiler::SCC_const*>,std::allocator<google::protobuf::compiler::SCC_const*>>
                     ::_M_insert_unique<google::protobuf::compiler::SCC_const*const&>
                               ((_Rb_tree<google::protobuf::compiler::SCC_const*,google::protobuf::compiler::SCC_const*,std::_Identity<google::protobuf::compiler::SCC_const*>,std::less<google::protobuf::compiler::SCC_const*>,std::allocator<google::protobuf::compiler::SCC_const*>>
                                 *)&local_d0,&local_140);
            pDVar16 = pVar22._8_8_;
            if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              __position_00._M_current =
                   *(pointer *)
                    ((long)&(pSVar18->children).
                            super__Vector_base<const_google::protobuf::compiler::SCC_*,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
                    + 8);
              if (__position_00._M_current ==
                  *(pointer *)
                   ((long)&(pSVar18->children).
                           super__Vector_base<const_google::protobuf::compiler::SCC_*,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
                   + 0x10)) {
                std::
                vector<google::protobuf::compiler::SCC_const*,std::allocator<google::protobuf::compiler::SCC_const*>>
                ::_M_realloc_insert<google::protobuf::compiler::SCC_const*const&>
                          (local_128,__position_00,&local_140);
                pDVar16 = extraout_RDX_06;
              }
              else {
                *__position_00._M_current = local_140;
                pppSVar7 = (pointer *)
                           ((long)&(pSVar18->children).
                                   super__Vector_base<const_google::protobuf::compiler::SCC_*,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
                           + 8);
                *pppSVar7 = *pppSVar7 + 1;
              }
            }
          }
        }
        if (local_120.
            super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_120.
                          super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
          pDVar16 = extraout_RDX_07;
        }
        ppDVar13 = local_130 + 1;
      } while (ppDVar13 != local_138);
    }
    std::
    _Rb_tree<const_google::protobuf::compiler::SCC_*,_const_google::protobuf::compiler::SCC_*,_std::_Identity<const_google::protobuf::compiler::SCC_*>,_std::less<const_google::protobuf::compiler::SCC_*>,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
    ::~_Rb_tree(&local_d0);
  }
  NVar21.scc = local_150->scc;
  NVar21.index = local_150->index;
  NVar21.lowlink = local_150->lowlink;
  return NVar21;
}

Assistant:

NodeData DFS(const Descriptor* descriptor) {
    // Must not have visited already.
    GOOGLE_DCHECK_EQ(cache_.count(descriptor), 0);

    // Mark visited by inserting in map.
    NodeData& result = cache_[descriptor];
    // Initialize data structures.
    result.index = result.lowlink = index_++;
    stack_.push_back(descriptor);

    // Recurse the fields / nodes in graph
    for (auto dep : DepsGenerator()(descriptor)) {
      GOOGLE_CHECK(dep);
      if (cache_.count(dep) == 0) {
        // unexplored node
        NodeData child_data = DFS(dep);
        result.lowlink = std::min(result.lowlink, child_data.lowlink);
      } else {
        NodeData child_data = cache_[dep];
        if (child_data.scc == nullptr) {
          // Still in the stack_ so we found a back edge
          result.lowlink = std::min(result.lowlink, child_data.index);
        }
      }
    }
    if (result.index == result.lowlink) {
      // This is the root of a strongly connected component
      SCC* scc = CreateSCC();
      while (true) {
        const Descriptor* scc_desc = stack_.back();
        scc->descriptors.push_back(scc_desc);
        // Remove from stack
        stack_.pop_back();
        cache_[scc_desc].scc = scc;

        if (scc_desc == descriptor) break;
      }

      // The order of descriptors is random and depends how this SCC was
      // discovered. In-order to ensure maximum stability we sort it by name.
      std::sort(scc->descriptors.begin(), scc->descriptors.end(),
                [](const Descriptor* a, const Descriptor* b) {
                  return a->full_name() < b->full_name();
                });
      AddChildren(scc);
    }
    return result;
  }